

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_codePointRange(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  int iVar1;
  uint32_t uVar2;
  JSValue JVar3;
  StringBuffer *b;
  StringBuffer b_s;
  uint32_t n;
  uint32_t i;
  uint32_t end;
  uint32_t start;
  int in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  JSContext *ctx_00;
  JSValueUnion in_stack_ffffffffffffff98;
  list_head *in_stack_ffffffffffffffa0;
  uint local_44;
  uint32_t local_40;
  uint local_3c;
  JSValueUnion local_10;
  int64_t local_8;
  
  ctx_00 = (JSContext *)&stack0xffffffffffffff98;
  JVar3.tag = (int64_t)in_stack_ffffffffffffffa0;
  JVar3.u.ptr = in_stack_ffffffffffffff98.ptr;
  iVar1 = JS_ToUint32(ctx_00,(uint32_t *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),JVar3);
  if ((iVar1 != 0) ||
     (val.tag = (int64_t)in_stack_ffffffffffffffa0, val.u.ptr = in_stack_ffffffffffffff98.ptr,
     iVar1 = JS_ToUint32(ctx_00,(uint32_t *)
                                CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),val),
     iVar1 != 0)) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
    return _local_10;
  }
  uVar2 = min_uint32(local_40,0x110000);
  if (uVar2 < local_3c) {
    local_3c = uVar2;
  }
  if (0x10000 < uVar2) {
    in_stack_ffffffffffffff8c = uVar2;
    max_uint32(local_3c,0x10000);
  }
  iVar1 = string_buffer_init2((JSContext *)in_stack_ffffffffffffff98.ptr,(StringBuffer *)ctx_00,
                              in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  if (iVar1 != 0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
    return _local_10;
  }
  for (local_44 = local_3c; local_44 < uVar2; local_44 = local_44 + 1) {
    string_buffer_putc((StringBuffer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                       ,0);
  }
  JVar3 = string_buffer_end((StringBuffer *)ctx_00);
  return JVar3;
}

Assistant:

JSValue js_string_codePointRange(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    uint32_t start, end, i, n;
    StringBuffer b_s, *b = &b_s;

    if (JS_ToUint32(ctx, &start, argv[0]) ||
        JS_ToUint32(ctx, &end, argv[1]))
        return JS_EXCEPTION;
    end = min_uint32(end, 0x10ffff + 1);

    if (start > end) {
        start = end;
    }
    n = end - start;
    if (end > 0x10000) {
        n += end - max_uint32(start, 0x10000);
    }
    if (string_buffer_init2(ctx, b, n, end >= 0x100))
        return JS_EXCEPTION;
    for(i = start; i < end; i++) {
        string_buffer_putc(b, i);
    }
    return string_buffer_end(b);
}